

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_scene.cpp
# Opt level: O2

sector_t * __thiscall
FGLRenderer::RenderViewpoint
          (FGLRenderer *this,AActor *camera,GL_IRECT *bounds,float fov,float ratio,float fovratio,
          bool mainview,bool toscreen)

{
  player_t *ppVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  angle_t aVar6;
  Stereo3DMode *pSVar7;
  long *plVar8;
  uint eye;
  AActor *this_00;
  FGLRenderer *this_01;
  float fVar9;
  float fVar10;
  float fVar11;
  ScopedViewShifter viewShifter;
  float viewShift [3];
  sector_t *local_130;
  DAngle local_e0;
  double local_d8;
  double local_d0;
  undefined1 local_c8 [32];
  FColormapShader *local_a8;
  AActor *pAStack_a0;
  FLensShader *local_98;
  FFXAAShader *pFStack_90;
  float local_7c [3];
  OpenGLFrameBuffer *local_70;
  GLPortal *pGStack_68;
  GLPortal *local_60;
  FTonemapShader *pFStack_58;
  FColormapShader *local_50;
  AActor *pAStack_48;
  FLensShader *local_40;
  FFXAAShader *pFStack_38;
  undefined4 extraout_var;
  
  this->mSceneClearColor[0] = 0.0;
  this->mSceneClearColor[1] = 0.0;
  this->mSceneClearColor[2] = 0.0;
  this_00 = camera;
  R_SetupFrame(camera);
  SetViewArea((FGLRenderer *)this_00);
  sincos((double)SUB84(ViewPitch.Degrees * 11930464.711111112 + 6755399441055744.0,0) *
         1.4629180792671596e-09,&local_d0,&local_d8);
  local_d0 = (double)glset.pixelstretch * local_d0;
  dVar2 = asin(local_d0 / SQRT(local_d0 * local_d0 + local_d8 * local_d8));
  (this->mAngles).Pitch.Degrees = (float)dVar2 * 57.29578;
  (this->mAngles).Roll.Degrees = (float)ViewRoll.Degrees;
  fVar9 = (float)gl_frameMS;
  fVar11 = level.skyspeed2;
  fVar10 = fmodf(fVar9 * level.skyspeed1,1024.0);
  fVar9 = fmodf(fVar9 * fVar11,1024.0);
  this->mSky1Pos = fVar10 * 0.3515625;
  this->mSky2Pos = fVar9 * 0.3515625;
  ppVar1 = camera->player;
  if ((((ppVar1 != (player_t *)0x0) &&
       ((long)(ppVar1[-0x3b4b].frags + 7) / 0x2a0 == (long)consoleplayer)) &&
      (((ppVar1->cheats & 0x20) != 0 || ((r_deathcamera.Value == true && (camera->health < 1))))))
     && (ppVar1->mo == (APlayerPawn *)camera)) {
    camera = (AActor *)0x0;
  }
  this->mViewActor = camera;
  if (toscreen) {
    fVar9 = gl_exposure.Value;
    if (gl_exposure.Value == 0.0) {
      fVar9 = (float)(int)viewsector->lightlevel * (float)(int)viewsector->lightlevel *
              -1.3840832e-05 + 1.9;
      if (fVar9 <= 0.5) {
        fVar9 = 0.5;
      }
      fVar9 = fVar9 * 0.005 + this->mCameraExposure * 0.995;
    }
    this->mCameraExposure = fVar9;
    local_130 = viewsector;
    if (mainview && toscreen) {
      bVar3 = true;
      pSVar7 = s3d::Stereo3DMode::getCurrentMode();
      goto LAB_003f8c2e;
    }
  }
  local_130 = viewsector;
  bVar3 = false;
  pSVar7 = s3d::Stereo3DMode::getMonoMode();
LAB_003f8c2e:
  (*pSVar7->_vptr_Stereo3DMode[4])(pSVar7);
  eye = 0;
  while( true ) {
    iVar5 = (*pSVar7->_vptr_Stereo3DMode[2])(pSVar7);
    if (iVar5 <= (int)eye) break;
    iVar5 = (*pSVar7->_vptr_Stereo3DMode[3])(pSVar7,(ulong)eye);
    plVar8 = (long *)CONCAT44(extraout_var,iVar5);
    (**(code **)(*plVar8 + 0x28))(plVar8);
    SetOutputViewport(this,bounds);
    Set3DViewport(this,mainview);
    this->mDrawingScene2D = true;
    this->mCurrentFoV = fov;
    (**(code **)(*plVar8 + 0x10))(fov,ratio,fovratio,&local_70,plVar8);
    local_98 = local_40;
    pFStack_90 = pFStack_38;
    local_a8 = local_50;
    pAStack_a0 = pAStack_48;
    local_c8._16_8_ = local_60;
    local_c8._24_8_ = pFStack_58;
    local_c8._0_8_ = local_70;
    local_c8._8_8_ = pGStack_68;
    VSMatrix::loadIdentity(&gl_RenderState.mProjectionMatrix);
    this_01 = (FGLRenderer *)local_c8;
    VSMatrix::multMatrix(&gl_RenderState.mProjectionMatrix,(FLOATTYPE *)this_01);
    local_e0.Degrees = ViewAngle.Degrees;
    SetViewAngle(this,&local_e0);
    (**(code **)(*plVar8 + 0x20))((GLRenderer->mAngles).Yaw.Degrees,plVar8,local_7c);
    s3d::ScopedViewShifter::ScopedViewShifter((ScopedViewShifter *)this_01,local_7c);
    SetViewMatrix(this_01,(float)ViewPos.X,(float)ViewPos.Y,(float)ViewPos.Z,false,false);
    FRenderState::ApplyMatrices(&gl_RenderState);
    Clipper::Clear(&clipper);
    aVar6 = FrustumAngle(this);
    iVar5 = SUB84(ViewAngle.Degrees * 11930464.711111112 + 6755399441055744.0,0);
    Clipper::SafeAddClipRangeRealAngles(&clipper,aVar6 + iVar5,iVar5 - aVar6);
    ProcessScene(this,toscreen);
    if (bVar3) {
      EndDrawScene(this,local_130);
    }
    if ((mainview) && (bVar4 = FGLRenderBuffers::IsEnabled(), bVar4)) {
      FGLRenderBuffers::BlitSceneToTexture(this->mBuffers);
      BloomScene(this);
      TonemapScene(this);
      ColormapScene(this);
      LensDistortScene(this);
      PostProcessFXAA(this);
      FGLRenderBuffers::BindCurrentFB(this->mBuffers);
      (*_ptrc_glViewport)((this->mScreenViewport).left,(this->mScreenViewport).top,
                          (this->mScreenViewport).width,(this->mScreenViewport).height);
      DrawBlend(this,local_130);
    }
    this->mDrawingScene2D = false;
    iVar5 = (*pSVar7->_vptr_Stereo3DMode[6])(pSVar7);
    if (((char)iVar5 == '\0') && (bVar4 = FGLRenderBuffers::IsEnabled(), bVar4)) {
      FGLRenderBuffers::BlitToEyeTexture(this->mBuffers,eye);
    }
    (**(code **)(*plVar8 + 0x30))(plVar8);
    s3d::ScopedViewShifter::~ScopedViewShifter((ScopedViewShifter *)local_c8);
    eye = eye + 1;
  }
  (*pSVar7->_vptr_Stereo3DMode[5])(pSVar7);
  gl_frameCount = gl_frameCount + 1;
  FInterpolator::RestoreInterpolations(&interpolator);
  return local_130;
}

Assistant:

sector_t * FGLRenderer::RenderViewpoint (AActor * camera, GL_IRECT * bounds, float fov, float ratio, float fovratio, bool mainview, bool toscreen)
{       
	sector_t * lviewsector;
	mSceneClearColor[0] = 0.0f;
	mSceneClearColor[1] = 0.0f;
	mSceneClearColor[2] = 0.0f;
	R_SetupFrame (camera);
	SetViewArea();

	// We have to scale the pitch to account for the pixel stretching, because the playsim doesn't know about this and treats it as 1:1.
	double radPitch = ViewPitch.Normalized180().Radians();
	double angx = cos(radPitch);
	double angy = sin(radPitch) * glset.pixelstretch;
	double alen = sqrt(angx*angx + angy*angy);

	mAngles.Pitch = (float)RAD2DEG(asin(angy / alen));
	mAngles.Roll.Degrees = ViewRoll.Degrees;

	// Scroll the sky
	mSky1Pos = (float)fmod(gl_frameMS * level.skyspeed1, 1024.f) * 90.f/256.f;
	mSky2Pos = (float)fmod(gl_frameMS * level.skyspeed2, 1024.f) * 90.f/256.f;



	if (camera->player && camera->player-players==consoleplayer &&
		((camera->player->cheats & CF_CHASECAM) || (r_deathcamera && camera->health <= 0)) && camera==camera->player->mo)
	{
		mViewActor=NULL;
	}
	else
	{
		mViewActor=camera;
	}

	if (toscreen)
	{
		if (gl_exposure == 0.0f)
		{
			float light = viewsector->lightlevel / 255.0f;
			float exposure = MAX(1.0f + (1.0f - light * light) * 0.9f, 0.5f);
			mCameraExposure = mCameraExposure * 0.995f + exposure * 0.005f;
		}
		else
		{
			mCameraExposure = gl_exposure;
		}
	}

	// 'viewsector' will not survive the rendering so it cannot be used anymore below.
	lviewsector = viewsector;

	// Render (potentially) multiple views for stereo 3d
	float viewShift[3];
	const s3d::Stereo3DMode& stereo3dMode = mainview && toscreen? s3d::Stereo3DMode::getCurrentMode() : s3d::Stereo3DMode::getMonoMode();
	stereo3dMode.SetUp();
	for (int eye_ix = 0; eye_ix < stereo3dMode.eye_count(); ++eye_ix)
	{
		const s3d::EyePose * eye = stereo3dMode.getEyePose(eye_ix);
		eye->SetUp();
		// TODO: stereo specific viewport - needed when implementing side-by-side modes etc.
		SetOutputViewport(bounds);
		Set3DViewport(mainview);
		mDrawingScene2D = true;
		mCurrentFoV = fov;
		// Stereo mode specific perspective projection
		SetProjection( eye->GetProjection(fov, ratio, fovratio) );
		// SetProjection(fov, ratio, fovratio);	// switch to perspective mode and set up clipper
		SetViewAngle(ViewAngle);
		// Stereo mode specific viewpoint adjustment - temporarily shifts global ViewPos
		eye->GetViewShift(GLRenderer->mAngles.Yaw.Degrees, viewShift);
		s3d::ScopedViewShifter viewShifter(viewShift);
		SetViewMatrix(ViewPos.X, ViewPos.Y, ViewPos.Z, false, false);
		gl_RenderState.ApplyMatrices();

		clipper.Clear();
		angle_t a1 = FrustumAngle();
		clipper.SafeAddClipRangeRealAngles(ViewAngle.BAMs() + a1, ViewAngle.BAMs() - a1);

		ProcessScene(toscreen);
		if (mainview && toscreen) EndDrawScene(lviewsector);	// do not call this for camera textures.
		if (mainview && FGLRenderBuffers::IsEnabled())
		{
			mBuffers->BlitSceneToTexture();
			BloomScene();
			TonemapScene();
			ColormapScene();
			LensDistortScene();
			PostProcessFXAA();

			// This should be done after postprocessing, not before.
			mBuffers->BindCurrentFB();
			glViewport(mScreenViewport.left, mScreenViewport.top, mScreenViewport.width, mScreenViewport.height);
			DrawBlend(lviewsector);
		}
		mDrawingScene2D = false;
		if (!stereo3dMode.IsMono() && FGLRenderBuffers::IsEnabled())
			mBuffers->BlitToEyeTexture(eye_ix);
		eye->TearDown();
	}
	stereo3dMode.TearDown();

	gl_frameCount++;	// This counter must be increased right before the interpolations are restored.
	interpolator.RestoreInterpolations ();
	return lviewsector;
}